

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O3

void call_init_write_memory(qpdf_data qpdf)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  QPDFWriter *pQVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  undefined1 local_29;
  QPDFWriter *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_20 [2];
  
  local_28 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<QPDFWriter,std::allocator<QPDFWriter>,QPDF&>
            (a_Stack_20,&local_28,(allocator<QPDFWriter> *)&local_29,
             (qpdf->qpdf).super___shared_ptr<QPDF,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  _Var2._M_pi = a_Stack_20[0]._M_pi;
  pQVar1 = local_28;
  local_28 = (QPDFWriter *)0x0;
  a_Stack_20[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this = (qpdf->qpdf_writer).super___shared_ptr<QPDFWriter,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi;
  (qpdf->qpdf_writer).super___shared_ptr<QPDFWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pQVar1;
  (qpdf->qpdf_writer).super___shared_ptr<QPDFWriter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
    if (a_Stack_20[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_20[0]._M_pi);
    }
  }
  QPDFWriter::setOutputMemory
            ((qpdf->qpdf_writer).super___shared_ptr<QPDFWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  return;
}

Assistant:

static void
call_init_write_memory(qpdf_data qpdf)
{
    qpdf->qpdf_writer = std::make_shared<QPDFWriter>(*(qpdf->qpdf));
    qpdf->qpdf_writer->setOutputMemory();
}